

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::
MessageDifferencerTest_RepeatedFieldSmartSetTest_IdenticalElements_Test::TestBody
          (MessageDifferencerTest_RepeatedFieldSmartSetTest_IdenticalElements_Test *this)

{
  TestField *pTVar1;
  pointer *__ptr_2;
  pointer *__ptr;
  char *in_R9;
  AssertionResult gtest_ar_;
  TestField elem;
  TestDiffMessage msg2;
  TestDiffMessage msg1;
  MessageDifferencer differencer;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_3c8;
  AssertHelper local_3c0;
  internal local_3b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3b0;
  string local_3a8;
  TestField local_388;
  undefined1 local_330 [184];
  undefined1 local_278 [184];
  MessageDifferencer local_1c0;
  
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_278,(Arena *)0x0);
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_330,(Arena *)0x0);
  proto2_unittest::TestField::TestField(&local_388,(Arena *)0x0);
  local_388.field_0._impl_.b_ = 1;
  local_388.field_0._56_8_ = &DAT_100000001;
  local_388.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_388.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 0xe;
  pTVar1 = (TestField *)
           protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_278 + 0x70),
                      Arena::DefaultConstruct<proto2_unittest::TestField>);
  proto2_unittest::TestField::CopyFrom(pTVar1,&local_388);
  pTVar1 = (TestField *)
           protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_278 + 0x70),
                      Arena::DefaultConstruct<proto2_unittest::TestField>);
  proto2_unittest::TestField::CopyFrom(pTVar1,&local_388);
  pTVar1 = (TestField *)
           protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_330 + 0x70),
                      Arena::DefaultConstruct<proto2_unittest::TestField>);
  proto2_unittest::TestField::CopyFrom(pTVar1,&local_388);
  pTVar1 = (TestField *)
           protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_330 + 0x70),
                      Arena::DefaultConstruct<proto2_unittest::TestField>);
  proto2_unittest::TestField::CopyFrom(pTVar1,&local_388);
  util::MessageDifferencer::MessageDifferencer(&local_1c0);
  util::MessageDifferencer::set_repeated_field_comparison(&local_1c0,AS_SMART_SET);
  local_3b8[0] = (internal)
                 util::MessageDifferencer::Compare
                           (&local_1c0,(Message *)local_278,(Message *)local_330);
  local_3b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_3b8[0]) {
    testing::Message::Message((Message *)&local_3c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_3a8,local_3b8,(AssertionResult *)0x126d6fd,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x680,local_3a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_3c0,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
      operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
    }
    if (local_3c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_3c8._M_head_impl + 8))();
    }
  }
  if (local_3b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3b0,local_3b0);
  }
  util::MessageDifferencer::~MessageDifferencer(&local_1c0);
  proto2_unittest::TestField::~TestField(&local_388);
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_330);
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_278);
  return;
}

Assistant:

TEST(MessageDifferencerTest, RepeatedFieldSmartSetTest_IdenticalElements) {
  // Create the testing protos
  proto2_unittest::TestDiffMessage msg1;
  proto2_unittest::TestDiffMessage msg2;
  proto2_unittest::TestField elem;

  elem.set_a(1);
  elem.set_b(1);
  elem.set_c(1);

  *msg1.add_rm() = elem;
  *msg1.add_rm() = elem;
  *msg2.add_rm() = elem;
  *msg2.add_rm() = elem;

  util::MessageDifferencer differencer;
  differencer.set_repeated_field_comparison(
      util::MessageDifferencer::AS_SMART_SET);
  EXPECT_TRUE(differencer.Compare(msg1, msg2));
}